

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_core.c
# Opt level: O3

void grasshopper_set_decrypt_key(grasshopper_round_keys_t *subkeys,grasshopper_key_t *key)

{
  byte bVar1;
  byte bVar2;
  undefined1 *puVar3;
  uint j;
  int iVar4;
  long lVar5;
  byte bVar6;
  long lVar7;
  
  grasshopper_set_encrypt_key(subkeys,key);
  puVar3 = (undefined1 *)((long)subkeys->k + 0x11);
  lVar5 = 1;
  do {
    iVar4 = 0;
    do {
      bVar6 = subkeys->k[lVar5].b[0];
      lVar7 = 0;
      do {
        bVar1 = puVar3[lVar7];
        bVar2 = 0;
        puVar3[lVar7 + -1] = bVar1;
        if (((ulong)bVar1 != 0) && (grasshopper_lvec[lVar7] != 0)) {
          bVar2 = grasshopper_galois_alpha_to
                  [(ushort)((ushort)grasshopper_galois_index_of[grasshopper_lvec[lVar7]] +
                           (ushort)grasshopper_galois_index_of[bVar1]) % 0xff];
        }
        bVar6 = bVar6 ^ bVar2;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0xf);
      subkeys->k[lVar5].b[0xf] = bVar6;
      iVar4 = iVar4 + 1;
    } while (iVar4 != 0x10);
    lVar5 = lVar5 + 1;
    puVar3 = puVar3 + 0x10;
  } while (lVar5 != 10);
  return;
}

Assistant:

void grasshopper_set_decrypt_key(grasshopper_round_keys_t* subkeys, const grasshopper_key_t* key) {
		int i;
    grasshopper_set_encrypt_key(subkeys, key);

    for (i = 1; i < 10; i++) {
        grasshopper_l_inv(&subkeys->k[i]);
    }
}